

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O3

bool __thiscall ConvexDecomposition::CTri::samePlane(CTri *this,CTri *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)(t->mPlaneD - this->mPlaneD)),auVar4);
  if (((auVar4._0_4_ <= 0.001) &&
      (auVar1._8_4_ = 0x7fffffff, auVar1._0_8_ = 0x7fffffff7fffffff, auVar1._12_4_ = 0x7fffffff,
      auVar4 = vandps_avx512vl(ZEXT416((uint)((t->mNormal).x - (this->mNormal).x)),auVar1),
      auVar4._0_4_ <= 0.001)) &&
     (auVar2._8_4_ = 0x7fffffff, auVar2._0_8_ = 0x7fffffff7fffffff, auVar2._12_4_ = 0x7fffffff,
     auVar4 = vandps_avx512vl(ZEXT416((uint)((t->mNormal).y - (this->mNormal).y)),auVar2),
     auVar4._0_4_ <= 0.001)) {
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(ZEXT416((uint)((t->mNormal).z - (this->mNormal).z)),auVar3);
    return auVar4._0_4_ <= 0.001;
  }
  return false;
}

Assistant:

bool samePlane(const CTri &t) const
	{
		const float THRESH = 0.001f;
    float dd = fabsf( t.mPlaneD - mPlaneD );
    if ( dd > THRESH ) return false;
    dd = fabsf( t.mNormal.x - mNormal.x );
    if ( dd > THRESH ) return false;
    dd = fabsf( t.mNormal.y - mNormal.y );
    if ( dd > THRESH ) return false;
    dd = fabsf( t.mNormal.z - mNormal.z );
    if ( dd > THRESH ) return false;
    return true;
	}